

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Deserializer::BreakdownV1ArrayName
          (BP5Deserializer *this,char *Name,char **base_name_p,DataType *type_p,int *element_size_p,
          bool *Operator,bool *MinMax)

{
  int iVar1;
  char *pcVar2;
  undefined4 *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  undefined4 *in_R8;
  undefined1 *in_R9;
  bool bVar3;
  undefined1 *in_stack_00000008;
  char *OpStart;
  int Len;
  char *Plus;
  char *NameStart;
  int ElementSize;
  int Type;
  int local_4c;
  char *local_48;
  char *local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  undefined8 *local_18;
  char *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pcVar2 = strchr(in_RSI + 4,0x5f);
  local_40 = strchr(pcVar2 + 1,0x5f);
  local_40 = local_40 + 1;
  __isoc99_sscanf(local_10 + 4,"%d_%d",&local_38,&local_34);
  local_48 = strchr(local_10,0x2b);
  *in_stack_00000008 = 0;
  while( true ) {
    bVar3 = false;
    if (local_48 != (char *)0x0) {
      bVar3 = *local_48 == '+';
    }
    if (!bVar3) break;
    iVar1 = __isoc99_sscanf(local_48,"+%dO",&local_4c);
    if (iVar1 == 1) {
      *local_30 = 1;
      local_48 = strchr(local_48,0x4f);
      local_48 = local_48 + (long)local_4c + 1;
    }
    else {
      iVar1 = strncmp(local_48,"+MM",3);
      if (iVar1 == 0) {
        *in_stack_00000008 = 1;
        local_48 = local_48 + 3;
      }
    }
  }
  *local_28 = local_38;
  *local_20 = local_34;
  pcVar2 = strdup(local_40);
  *local_18 = pcVar2;
  pcVar2 = strrchr((char *)*local_18,0x5f);
  *pcVar2 = '\0';
  return;
}

Assistant:

void BP5Deserializer::BreakdownV1ArrayName(const char *Name, char **base_name_p, DataType *type_p,
                                           int *element_size_p, bool &Operator, bool &MinMax)
{
    int Type;
    int ElementSize;

    const char *NameStart = strchr(strchr(Name + 4, '_') + 1, '_') + 1;
    // + 3 to skip BP5_ or bp5_ prefix
    sscanf(Name + 4, "%d_%d", &ElementSize, &Type);
    const char *Plus = strchr(Name, '+');
    MinMax = false;
    while (Plus && (*Plus == '+'))
    {
        int Len;
        if (sscanf(Plus, "+%dO", &Len) == 1)
        { // Operator Spec
            Operator = true;
            const char *OpStart = strchr(Plus, 'O') + 1;
            Plus = OpStart + Len;
        }
        else if (strncmp(Plus, "+MM", 3) == 0)
        {
            MinMax = true;
            Plus += 3;
        }
    }
    *element_size_p = ElementSize;
    *type_p = (DataType)Type;
    *base_name_p = strdup(NameStart);
    *(strrchr(*base_name_p, '_')) = 0;
}